

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

bool google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (Message *message,FieldDescriptorSet *extensions)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Alloc_node __an;
  long *plVar3;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x10))(plVar3,message);
  plVar4 = (long *)*plVar4;
  if ((plVar4 == (long *)0x0) || ((int)((ulong)(plVar4[1] - *plVar4) >> 4) < 1)) {
    (**(code **)(*plVar3 + 0x80))(plVar3,message);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CollectExtensions(const Message& message,
                       FieldDescriptorSet* extensions) {
  const Reflection* reflection = message.GetReflection();

  // There are unknown fields that could be extensions, thus this call fails.
  if (reflection->GetUnknownFields(message).field_count() > 0) return false;

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);

  for (int i = 0; i < fields.size(); i++) {
    if (fields[i]->is_extension()) extensions->insert(fields[i]);

    if (GetJavaType(fields[i]) == JAVATYPE_MESSAGE) {
      if (fields[i]->is_repeated()) {
        int size = reflection->FieldSize(message, fields[i]);
        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, fields[i], j);
          if (!CollectExtensions(sub_message, extensions)) return false;
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, fields[i]);
        if (!CollectExtensions(sub_message, extensions)) return false;
      }
    }
  }

  return true;
}